

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch.cpp
# Opt level: O0

int __thiscall asmjit::ArchInfo::init(ArchInfo *this,EVP_PKEY_CTX *ctx)

{
  uint8_t in_DL;
  uint32_t index;
  char *in_stack_000003d0;
  int in_stack_000003dc;
  char *in_stack_000003e0;
  uint local_24;
  
  local_24 = (uint)ctx;
  if (5 < local_24) {
    local_24 = 0;
  }
  this->field_0 = *(anon_union_4_2_424c626f_for_ArchInfo_0 *)(archInfoTable + (ulong)local_24 * 4);
  if ((this->field_0).field_0._type == local_24) {
    (this->field_0).field_0._type = (uint8_t)ctx;
    (this->field_0).field_0._subType = in_DL;
    return (int)this;
  }
  DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
}

Assistant:

ASMJIT_FAVOR_SIZE void ArchInfo::init(uint32_t type, uint32_t subType) noexcept {
  uint32_t index = type < ASMJIT_ARRAY_SIZE(archInfoTable) ? type : uint32_t(0);

  // Make sure the `archInfoTable` array is correctly indexed.
  _signature = archInfoTable[index];
  ASMJIT_ASSERT(_type == index);

  // Even if the architecture is not known we setup its type and sub-type,
  // however, such architecture is not really useful.
  _type = type;
  _subType = subType;
}